

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall
imrt::Collimator::initializeCoordinates
          (Collimator *this,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *coord_files)

{
  double dVar1;
  pointer ppVar2;
  pointer pdVar3;
  pointer ppVar4;
  pointer ppVar5;
  char cVar6;
  int iVar7;
  istream *piVar8;
  vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *this_00;
  iterator iVar9;
  mapped_type *pmVar10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  runtime_error *this_01;
  int iVar15;
  int j;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  int angle;
  double y;
  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  *local_448;
  double x;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_438;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_430;
  list<int,_std::allocator<int>_> *local_428;
  ulong local_420;
  _Base_ptr local_418;
  string linec;
  pair<double,_double> local_3f0;
  string line;
  stringstream ss;
  string local_3a8 [368];
  ifstream myfile;
  
  local_438 = coord_files;
  std::ifstream::ifstream(&myfile);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  linec._M_dataplus._M_p = (pointer)&linec.field_2;
  linec._M_string_length = 0;
  linec.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_428 = &this->angles;
  local_448 = &this->angle_coord;
  local_418 = &(this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_430 = &this->nb_angle_beamlets;
  uVar16 = 0;
  while( true ) {
    ppVar2 = (local_438->
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(local_438->
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) / 0x28) <= uVar16
       ) {
      pdVar3 = (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar7 = (int)((ulong)((long)(this->xcoord).super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->xcoord).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
      this->xdim = iVar7;
      iVar15 = (int)((ulong)((long)pdVar3 -
                            (long)(this->ycoord).super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      this->ydim = iVar15;
      this->nb_beamlets = iVar15 * iVar7;
      setActiveBeamlets(this,local_448);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::__cxx11::string::~string((string *)&linec);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&myfile);
      return;
    }
    angle = ppVar2[uVar16].first;
    local_420 = uVar16;
    std::__cxx11::list<int,_std::allocator<int>_>::push_back(local_428,&angle);
    std::ifstream::open((string *)&myfile,
                        (int)(local_438->
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + (int)uVar16 * 0x28 + _S_in
                       );
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 == '\0') break;
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&myfile,(string *)&line);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + (int)(istream *)&ss);
      std::__cxx11::stringbuf::str(local_3a8);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ss,(string *)&linec,'\t');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ss,(string *)&linec,'\t');
      x = atof(linec._M_dataplus._M_p);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ss,(string *)&linec,'\t');
      y = atof(linec._M_dataplus._M_p);
      this_00 = (vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                std::
                map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                ::operator[](local_448,&angle);
      local_3f0.first = x;
      local_3f0.second = y;
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<std::pair<double,double>>(this_00,&local_3f0);
      iVar9 = std::
              _Rb_tree<double,_std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
              ::find((_Rb_tree<double,_std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                      *)this,&x);
      if (iVar9._M_node == local_418) {
        pmVar10 = std::
                  map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->beam_coord,&x);
        std::vector<double,_std::allocator<double>_>::push_back(pmVar10,&y);
        insertXorder(this,x);
      }
      else {
        pmVar10 = std::
                  map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->beam_coord,&x);
        pdVar3 = (pmVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pmVar10 = std::
                  map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->beam_coord,&x);
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                           (pdVar3,(pmVar10->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish,&y);
        pmVar10 = std::
                  map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->beam_coord,&x);
        bVar18 = _Var11._M_current !=
                 (pmVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar17 = 0;
        uVar16 = 0;
        while( true ) {
          pmVar10 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&x);
          if ((ulong)((long)(pmVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pmVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3) <= uVar16 || bVar18) break;
          pmVar10 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&x);
          dVar1 = (pmVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar16];
          bVar18 = y < dVar1;
          if (y < dVar1) {
            pmVar10 = std::
                      map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[](&this->beam_coord,&x);
            pmVar12 = std::
                      map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[](&this->beam_coord,&x);
            std::vector<double,_std::allocator<double>_>::insert
                      (pmVar10,(double *)
                               ((long)(pmVar12->super__Vector_base<double,_std::allocator<double>_>)
                                      ._M_impl.super__Vector_impl_data._M_start + lVar17),&y);
          }
          uVar16 = uVar16 + 1;
          lVar17 = lVar17 + 8;
        }
        if (!bVar18) {
          pmVar10 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&x);
          std::vector<double,_std::allocator<double>_>::push_back(pmVar10,&y);
        }
      }
      insertYorder(this,y);
    }
    std::ifstream::close();
    pmVar13 = std::
              map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
              ::operator[](local_448,&angle);
    ppVar4 = (pmVar13->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pmVar13->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pmVar14 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](local_430,&angle);
    *pmVar14 = (mapped_type)((ulong)((long)ppVar5 - (long)ppVar4) >> 4);
    uVar16 = local_420 + 1;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"error reading file.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Collimator::initializeCoordinates(vector < pair<int, string> >& coord_files) {
  ifstream myfile;
  string line, linec;
  stringstream ss;
  double x, y;
  bool flag;

  //nb_angles=coord_files.size();

  for (int i=0 ; i < coord_files.size(); i++) {
    // Open file
    int angle = coord_files[i].first;
    angles.push_back(angle);
    myfile.open(coord_files[i].second);
    if (!myfile.is_open())
      throw runtime_error("error reading file.");

    // Read lines of the file
    while (getline (myfile,line)) {
      flag=false;
      ss.clear(); ss.str(line);
      getline (ss,linec,'\t'); //the first number is discarded (beamlet id)
      getline (ss,linec,'\t');
      x = atof(linec.c_str());
      getline (ss,linec,'\t');
      y = atof(linec.c_str());


      angle_coord[angle].push_back(make_pair(x,y));

      if (beam_coord.find(x) == beam_coord.end()) {
        // New x coordinate
        beam_coord[x].push_back(y);
        insertXorder(x);
        insertYorder(y);
      } else {
        if (find(beam_coord[x].begin(), beam_coord[x].end(), y) != beam_coord[x].end())
          flag=true;
        // New y coordinate: insert in order
        for (int j=0; j < beam_coord[x].size() && !flag; j++) {
          if (beam_coord[x][j] > y) {
            beam_coord[x].insert(beam_coord[x].begin()+j, y);
            flag=true;
          }
        }
        if (!flag) beam_coord[x].push_back(y);
        insertYorder(y);
      }
    }
    myfile.close();
    nb_angle_beamlets[angle]=(angle_coord[angle].size());
  }
  xdim = xcoord.size();
  ydim = ycoord.size();
  nb_beamlets= xdim*ydim;
  //printCoordinates();

  setActiveBeamlets(angle_coord);
  //printActiveBeam();
}